

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int av1_intrabc_hash_search
              (AV1_COMP *cpi,MACROBLOCKD *xd,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
              IntraBCHashInfo *intrabc_hash_info,FULLPEL_MV *best_mv)

{
  BLOCK_SIZE BVar1;
  MV_COST_TYPE MVar2;
  ushort uVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  buf_2d *pbVar7;
  buf_2d *pbVar8;
  MV *pMVar9;
  int32_t iVar10;
  int iVar11;
  ushort *puVar12;
  byte bVar13;
  int iVar14;
  short sVar15;
  uint uVar16;
  int iVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  short sVar26;
  int iVar27;
  Iterator iterator;
  uint32_t hash_value2;
  uint32_t hash_value1;
  FULLPEL_MV_STATS mv_stats;
  Iterator local_b8;
  FULLPEL_MOTION_SEARCH_PARAMS *local_a8;
  ulong local_a0;
  ulong local_98;
  hash_table *local_90;
  uint local_88;
  int local_84;
  int local_80;
  int local_7c;
  uint32_t local_78;
  uint32_t local_74;
  ulong local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  FULLPEL_MV *local_48;
  int local_3c;
  uint local_38;
  uint local_34;
  
  iVar25 = 0x7fffffff;
  if ((((cpi->common).features.allow_screen_content_tools == true) &&
      ((cpi->common).features.allow_intrabc == true)) &&
     (((cpi->common).current_frame.frame_type & 0xfd) == 0)) {
    BVar1 = ms_params->bsize;
    bVar13 = block_size_wide[BVar1];
    local_a0 = (ulong)bVar13;
    local_98 = (ulong)block_size_high[BVar1];
    if (bVar13 == block_size_high[BVar1]) {
      pbVar7 = (ms_params->ms_buffers).src;
      local_70 = (ulong)(uint)xd->mi_row;
      iVar14 = xd->mi_col;
      local_a8 = ms_params;
      local_48 = best_mv;
      av1_get_block_hash_value
                (intrabc_hash_info,pbVar7->buf,pbVar7->stride,(uint)bVar13,&local_74,&local_78,
                 (uint)xd->cur_buf->flags >> 3 & 1);
      local_90 = &intrabc_hash_info->intrabc_hash_table;
      iVar10 = av1_hash_table_count(&intrabc_hash_info->intrabc_hash_table,local_74);
      iVar25 = 0x7fffffff;
      if (1 < iVar10) {
        local_80 = iVar14 * 4;
        iVar25 = (int)local_70;
        local_7c = iVar25 * 4;
        local_b8 = av1_hash_get_first_iterator(local_90,local_74);
        local_90 = (hash_table *)CONCAT44(local_90._4_4_,iVar25 << 5);
        local_84 = iVar14 << 5;
        local_98 = (ulong)(uint)((int)local_98 << 3);
        local_a0 = (ulong)(uint)((int)local_a0 << 3);
        local_58 = 0x10003L >> (BVar1 & 0x3f);
        local_60 = 0x20005L >> (BVar1 & 0x3f);
        local_50 = (ulong)((iVar14 >> 4) - 4);
        iVar25 = 0x7fffffff;
        do {
          puVar12 = (ushort *)aom_iterator_get(&local_b8);
          if (local_78 == *(uint32_t *)(puVar12 + 2)) {
            uVar16 = (uint)puVar12[1] - local_7c;
            iVar14 = ((int)(uVar16 * 0x80000) >> 0x10) + (int)local_90;
            iVar22 = (xd->tile).mi_row_start * 0x20;
            if (iVar22 <= iVar14) {
              iVar27 = (uint)*puVar12 - local_80;
              iVar23 = (iVar27 * 0x80000 >> 0x10) + local_84;
              uVar5 = (xd->tile).mi_col_start;
              iVar24 = uVar5 * 0x20;
              if ((iVar24 <= iVar23) &&
                 (iVar11 = (int)local_98 + iVar14, iVar11 <= (xd->tile).mi_row_end * 0x20)) {
                iVar17 = iVar23 + (int)local_a0;
                iVar6 = (xd->tile).mi_col_end;
                if ((iVar17 <= iVar6 * 0x20) &&
                   (((xd->is_chroma_ref != true || (((cpi->common).seq_params)->monochrome != '\0'))
                    || ((((local_58 & 1) == 0 ||
                         ((xd->plane[1].subsampling_x == 0 || (iVar24 + 0x20 <= iVar23)))) &&
                        (((local_60 & 1) == 0 ||
                         ((xd->plane[1].subsampling_y == 0 || (iVar22 + 0x20 <= iVar14)))))))))) {
                  bVar13 = (byte)((cpi->common).seq_params)->mib_size_log2;
                  iVar22 = (int)local_70 >> (bVar13 & 0x1f);
                  iVar23 = 4 << (bVar13 & 0x1f);
                  iVar14 = ((iVar11 >> 3) + -1) / iVar23;
                  if (iVar14 <= iVar22) {
                    iVar24 = (iVar17 >> 3) + -1 >> 6;
                    iVar11 = ((int)(iVar6 + ~uVar5) >> 4) + 1;
                    if ((iVar14 * iVar11 + iVar24 < iVar22 * iVar11 + (int)local_50) &&
                       (iVar24 < (int)((iVar22 - iVar14) * ((0x40 < iVar23) + 5) + (int)local_50)))
                    {
                      sVar26 = (short)iVar27;
                      if (((local_a8->mv_limits).col_min <= (int)sVar26) &&
                         ((int)sVar26 <= (local_a8->mv_limits).col_max)) {
                        sVar15 = (short)uVar16;
                        if (((local_a8->mv_limits).row_min <= (int)sVar15) &&
                           ((int)sVar15 <= (local_a8->mv_limits).row_max)) {
                          pbVar7 = (local_a8->ms_buffers).src;
                          pbVar8 = (local_a8->ms_buffers).ref;
                          iVar14 = pbVar8->stride;
                          local_38 = (*local_a8->vfp->vf)
                                               (pbVar7->buf,pbVar7->stride,
                                                pbVar8->buf + ((int)sVar26 + sVar15 * iVar14),iVar14
                                                ,&local_34);
                          MVar2 = (local_a8->mv_cost_params).mv_cost_type;
                          local_3c = 0;
                          if (MVar2 != '\x04') {
                            pMVar9 = (local_a8->mv_cost_params).ref_mv;
                            uVar3 = pMVar9->row;
                            local_88 = (uint)uVar3;
                            sVar18 = sVar15 * 8 - uVar3;
                            sVar4 = pMVar9->col;
                            sVar20 = sVar26 * 8 - sVar4;
                            sVar19 = -sVar18;
                            if (0 < sVar18) {
                              sVar19 = sVar18;
                            }
                            sVar21 = -sVar20;
                            if (0 < sVar20) {
                              sVar21 = sVar20;
                            }
                            if (MVar2 == '\x03') {
                              local_3c = (int)sVar21 + (int)sVar19 >> 3;
                            }
                            else if (MVar2 == '\x01') {
                              local_3c = (int)sVar21 + (int)sVar19 >> 2;
                            }
                            else if (MVar2 == '\0') {
                              local_68 = (long)(local_a8->mv_cost_params).error_per_bit;
                              local_3c = (int)(((long)(local_a8->mv_cost_params).mvcost[1][sVar20] +
                                                (long)(local_a8->mv_cost_params).mvcost[0][sVar18] +
                                               (long)*(int *)((long)(local_a8->mv_cost_params).
                                                                    mvjcost +
                                                             (ulong)((uint)((short)(sVar26 * 8) !=
                                                                           sVar4) * 4 +
                                                                    (uint)((ushort)(sVar15 * 8) !=
                                                                          uVar3) * 8))) * local_68 +
                                               0x2000U >> 0xe);
                            }
                          }
                          if ((int)(local_38 + local_3c) < iVar25) {
                            *local_48 = (FULLPEL_MV)(uVar16 & 0xffff | iVar27 * 0x10000);
                            iVar25 = local_38 + local_3c;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          aom_iterator_increment(&local_b8);
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
    }
  }
  return iVar25;
}

Assistant:

int av1_intrabc_hash_search(const AV1_COMP *cpi, const MACROBLOCKD *xd,
                            const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                            IntraBCHashInfo *intrabc_hash_info,
                            FULLPEL_MV *best_mv) {
  if (!av1_use_hash_me(cpi)) return INT_MAX;

  const BLOCK_SIZE bsize = ms_params->bsize;
  const int block_width = block_size_wide[bsize];
  const int block_height = block_size_high[bsize];

  if (block_width != block_height) return INT_MAX;

  const FullMvLimits *mv_limits = &ms_params->mv_limits;
  const MSBuffers *ms_buffer = &ms_params->ms_buffers;

  const uint8_t *src = ms_buffer->src->buf;
  const int src_stride = ms_buffer->src->stride;

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int x_pos = mi_col * MI_SIZE;
  const int y_pos = mi_row * MI_SIZE;

  uint32_t hash_value1, hash_value2;
  int best_hash_cost = INT_MAX;

  // for the hashMap
  hash_table *ref_frame_hash = &intrabc_hash_info->intrabc_hash_table;

  av1_get_block_hash_value(intrabc_hash_info, src, src_stride, block_width,
                           &hash_value1, &hash_value2, is_cur_buf_hbd(xd));

  const int count = av1_hash_table_count(ref_frame_hash, hash_value1);
  if (count <= 1) {
    return INT_MAX;
  }

  Iterator iterator = av1_hash_get_first_iterator(ref_frame_hash, hash_value1);
  for (int i = 0; i < count; i++, aom_iterator_increment(&iterator)) {
    block_hash ref_block_hash = *(block_hash *)(aom_iterator_get(&iterator));
    if (hash_value2 == ref_block_hash.hash_value2) {
      // Make sure the prediction is from valid area.
      const MV dv = { GET_MV_SUBPEL(ref_block_hash.y - y_pos),
                      GET_MV_SUBPEL(ref_block_hash.x - x_pos) };
      if (!av1_is_dv_valid(dv, &cpi->common, xd, mi_row, mi_col, bsize,
                           cpi->common.seq_params->mib_size_log2))
        continue;

      FULLPEL_MV hash_mv;
      hash_mv.col = ref_block_hash.x - x_pos;
      hash_mv.row = ref_block_hash.y - y_pos;
      if (!av1_is_fullmv_in_range(mv_limits, hash_mv)) continue;
      FULLPEL_MV_STATS mv_stats;
      const int refCost = get_mvpred_var_cost(ms_params, &hash_mv, &mv_stats);
      if (refCost < best_hash_cost) {
        best_hash_cost = refCost;
        *best_mv = hash_mv;
      }
    }
  }

  return best_hash_cost;
}